

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel.cc
# Opt level: O2

size_t MULTILABEL::read_cached_label(shared_data *param_1,void *v,io_buf *cache)

{
  size_t sVar1;
  size_t sVar2;
  char *c;
  
  v_array<unsigned_int>::clear((v_array<unsigned_int> *)v);
  sVar2 = 8;
  sVar1 = io_buf::buf_read(cache,&c,8);
  if (sVar1 < 8) {
    sVar2 = 0;
  }
  else {
    bufread_label((labels *)v,c,cache);
  }
  return sVar2;
}

Assistant:

size_t read_cached_label(shared_data*, void* v, io_buf& cache)
{
  labels* ld = (labels*)v;
  ld->label_v.clear();
  char* c;
  size_t total = sizeof(size_t);
  if (cache.buf_read(c, (int)total) < total)
    return 0;
  bufread_label(ld, c, cache);

  return total;
}